

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

Entry * __thiscall PartitionTable::firstoftype(PartitionTable *this,int type)

{
  int iVar1;
  int local_20;
  int i;
  int type_local;
  PartitionTable *this_local;
  
  local_20 = 0;
  while( true ) {
    if (3 < local_20) {
      return (Entry *)0x0;
    }
    iVar1 = Entry::type(this->_table + local_20);
    if (iVar1 == type) break;
    local_20 = local_20 + 1;
  }
  return this->_table + local_20;
}

Assistant:

Entry* firstoftype(int type)
    {
        for (int i=0 ; i<4 ; i++)
            if (_table[i].type()==type)
                return &_table[i];
        return 0;
    }